

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recursive_maximum_likelihood_parameter_generation.cc
# Opt level: O0

bool __thiscall
sptk::RecursiveMaximumLikelihoodParameterGeneration::Get
          (RecursiveMaximumLikelihoodParameterGeneration *this,
          vector<double,_std::allocator<double>_> *smoothed_static_parameters)

{
  pointer pdVar1;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first_00;
  int iVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  reference this_00;
  reference pvVar6;
  int iVar7;
  vector<double,_std::allocator<double>_> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  int m;
  double *output;
  int t;
  int static_size;
  int static_and_dynamic_size;
  RecursiveMaximumLikelihoodParameterGeneration *in_stack_00000150;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int iVar8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  iterator in_stack_ffffffffffffffa8;
  iterator in_stack_ffffffffffffffb0;
  bool local_1;
  
  if ((((ulong)in_RDI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start & 1) == 0) ||
     (in_RSI == (vector<double,_std::allocator<double>_> *)0x0)) {
    local_1 = false;
  }
  else {
    pdVar1 = in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    uVar3 = (**(code **)((long)*pdVar1 + 0x20))
                      (pdVar1,&in_RDI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_end_of_storage);
    if ((uVar3 & 1) == 0) {
      std::vector<double,_std::allocator<double>_>::size
                ((vector<double,_std::allocator<double>_> *)
                 &in_RDI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<double,_std::allocator<double>_>::begin(in_RDI);
      std::vector<double,_std::allocator<double>_>::begin(in_RDI);
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                in_stack_ffffffffffffff98._M_current,
                CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      __first._M_current._4_4_ = in_stack_ffffffffffffffa4;
      __first._M_current._0_4_ = in_stack_ffffffffffffffa0;
      std::
      fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                (__first,in_stack_ffffffffffffff98,
                 (double *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      in_stack_ffffffffffffffb0 = std::vector<double,_std::allocator<double>_>::begin(in_RDI);
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                in_stack_ffffffffffffff98._M_current,
                CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      in_stack_ffffffffffffffa8 = std::vector<double,_std::allocator<double>_>::end(in_RDI);
      __first_00._M_current._4_4_ = in_stack_ffffffffffffffa4;
      __first_00._M_current._0_4_ = in_stack_ffffffffffffffa0;
      std::
      fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                (__first_00,in_stack_ffffffffffffff98,
                 (double *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      if (*(int *)&in_RDI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish < 2) {
        return false;
      }
      *(int *)&in_RDI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish =
           *(int *)&in_RDI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish + -1;
    }
    Forward(in_stack_00000150);
    iVar2 = (*(code *)(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[2])();
    sVar4 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
    if (sVar4 != (long)iVar2) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffffb0._M_current,
                 (size_type)in_stack_ffffffffffffffa8._M_current);
    }
    iVar7 = ((*(int *)((long)&in_RDI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish + 4) -
             *(int *)((long)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_finish + 4)) + -1) %
            *(int *)((long)&in_RDI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start + 4);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
    for (iVar8 = 0; iVar8 < iVar2; iVar8 = iVar8 + 1) {
      this_00 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              *)&in_RDI[8].super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,(long)iVar8);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)iVar7);
      pvVar5[iVar8] = *pvVar6;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool RecursiveMaximumLikelihoodParameterGeneration::Get(
    std::vector<double>* smoothed_static_parameters) {
  if (!is_valid_ || NULL == smoothed_static_parameters) {
    return false;
  }

  if (!input_source_->Get(&buffer_.static_and_dynamic_parameters)) {
    const int static_and_dynamic_size(
        static_cast<int>(buffer_.static_and_dynamic_parameters.size() / 2));
    // Unobserbed mean is zero.
    std::fill(
        buffer_.static_and_dynamic_parameters.begin(),
        buffer_.static_and_dynamic_parameters.begin() + static_and_dynamic_size,
        0.0);
    // Unobserved variance is infinite.
    std::fill(
        buffer_.static_and_dynamic_parameters.begin() + static_and_dynamic_size,
        buffer_.static_and_dynamic_parameters.end(), kInf);
    if (num_remaining_frame_ <= 1) {
      return false;
    }
    --num_remaining_frame_;
  }
  Forward();

  const int static_size(GetSize());
  if (smoothed_static_parameters->size() !=
      static_cast<std::size_t>(static_size)) {
    smoothed_static_parameters->resize(static_size);
  }

  const int t((current_frame_ - num_past_frame_ - 1) % calculation_field_);
  double* output(&((*smoothed_static_parameters)[0]));
  for (int m(0); m < static_size; ++m) {
    output[m] = buffer_.c[m][t];
  }

  return true;
}